

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::GrammarOutputC::
createEnum<SGParser::Generator::GrammarOutputC::CreateNonterminalEnum(std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
          (GrammarOutputC *this,String *str,String *name,String *prefix,size_t size,
          anon_class_8_1_82fec0c9 enumValueNameGenerator)

{
  ulong uVar1;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  allocator<char> local_1a9;
  String local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  String local_148;
  undefined1 local_128 [8];
  anon_class_32_4_842515b9 listEnumValues;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  size_t local_38;
  size_t size_local;
  String *prefix_local;
  String *name_local;
  String *str_local;
  GrammarOutputC *this_local;
  anon_class_8_1_82fec0c9 enumValueNameGenerator_local;
  
  local_38 = size;
  size_local = (size_t)prefix;
  prefix_local = name;
  name_local = str;
  str_local = (String *)this;
  this_local = (GrammarOutputC *)enumValueNameGenerator.nonterminalVec;
  std::operator+(&local_78,"//////////////////////////// ",name);
  std::operator+(&local_58,&local_78," ////////////////////////////\n\n");
  std::__cxx11::string::operator+=((string *)name_local,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_c8,"namespace ",&this->namespaceName);
    std::operator+(&local_a8,&local_c8,"\n{\n\n");
    std::__cxx11::string::operator+=((string *)name_local,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  __lhs = "enum ";
  if ((this->useEnumClasses & 1U) != 0) {
    __lhs = "enum class ";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &listEnumValues.enumValueNameGenerator,__lhs,prefix_local);
  std::operator+(&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &listEnumValues.enumValueNameGenerator,"\n{\n");
  std::__cxx11::string::operator+=((string *)name_local,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
  local_128 = (undefined1  [8])&local_38;
  listEnumValues.size = (size_t *)name_local;
  listEnumValues.str = (String *)size_local;
  listEnumValues.prefix = (String *)&this_local;
  std::__cxx11::string::string((string *)&local_148);
  createEnum<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Grammar.cpp:1645:16)>
  ::anon_class_32_4_842515b9::operator()((anon_class_32_4_842515b9 *)local_128,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::operator+=((string *)name_local,"};\n");
  if ((this->createEnumStrings & 1U) != 0) {
    std::operator+(&local_188,"\nconstexpr char const* const StringifyEnum",prefix_local);
    std::operator+(&local_168,&local_188,"[] =\n{\n");
    std::__cxx11::string::operator+=((string *)name_local,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"\"",&local_1a9);
    createEnum<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Grammar.cpp:1645:16)>
    ::anon_class_32_4_842515b9::operator()((anon_class_32_4_842515b9 *)local_128,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    std::__cxx11::string::operator+=((string *)name_local,"};\n");
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_1f0,"\n} // namespace ",&this->namespaceName);
    std::operator+(&local_1d0,&local_1f0,"\n");
    std::__cxx11::string::operator+=((string *)name_local,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  return;
}

Assistant:

void GrammarOutputC::createEnum(String& str, const String& name, const String& prefix,
                                const size_t size,
                                EnumValueNameGenerator enumValueNameGenerator) const {
    // EnumValueNameGenerator signature check
    static_assert(std::is_invocable_r<String, EnumValueNameGenerator, size_t>::value,
                  "EnumValueNameGenerator should be callable with signature 'String(size_t)'");

    str += "//////////////////////////// " + name + " ////////////////////////////\n\n";

    // Begin namespace declaration of needed
    if (!namespaceName.empty())
        str += "namespace " + namespaceName + "\n{\n\n";

    // Enum type declaration
    str += (useEnumClasses ? "enum class " : "enum ") + name + "\n{\n";

    // Generate strings with the enum values, optionally enclose every value with 'enclosure'
    // string
    const auto listEnumValues = [&](const String& enclosure = String{}) {
        for (size_t i = 0u; i < size; ++i) {
            // Create comment with the value index, then
            // generate and add an enclosed enum value name
            str += StringWithFormat("    /*%zu*/ ", i) +
                   enclosure + prefix + enumValueNameGenerator(i) + enclosure +
                   (i != size - 1u ? ",\n" : "\n");
        }
    };

    listEnumValues();

    str += "};\n";

    // if needed, add an array of string literals to simplify an enum stringification
    if (createEnumStrings) {
        str += "\nconstexpr char const* const StringifyEnum" + name + "[] =\n{\n";
        // Generate strings as the enum values enclosed with double quotes
        listEnumValues("\"");
        str += "};\n";
    }

    // Close namespace declaration of needed
    if (!namespaceName.empty())
        str += "\n} // namespace " + namespaceName + "\n";
}